

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::KillDebugDeclares
          (DebugInfoManager *this,uint32_t variable_id)

{
  Instruction *inst;
  bool bVar1;
  pointer ppVar2;
  reference ppIVar3;
  IRContext *this_00;
  Instruction *dbg_decl;
  iterator __end3;
  iterator __begin3;
  set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range3;
  set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
  copy_dbg_decls;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_20;
  iterator dbg_decl_itr;
  bool modified;
  uint32_t variable_id_local;
  DebugInfoManager *this_local;
  
  dbg_decl_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  ._M_cur._3_1_ = 0;
  dbg_decl_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  ._M_cur._4_4_ = variable_id;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::find(&this->var_id_to_dbg_decl_,
              (key_type *)
              ((long)&dbg_decl_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      ._M_cur + 4));
  copy_dbg_decls._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
               ::end(&this->var_id_to_dbg_decl_);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      *)&copy_dbg_decls._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
                           *)&local_20);
    std::
    set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
    ::set((set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
           *)&__range3,&ppVar2->second);
    __end3 = std::
             set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin((set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range3);
    dbg_decl = (Instruction *)
               std::
               set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
               ::end((set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range3);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&dbg_decl), bVar1) {
      ppIVar3 = std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator*(&__end3);
      inst = *ppIVar3;
      this_00 = context(this);
      IRContext::KillInst(this_00,inst);
      dbg_decl_itr.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur._3_1_ = 1;
      std::_Rb_tree_const_iterator<spvtools::opt::Instruction_*>::operator++(&__end3);
    }
    std::
    unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
    ::erase(&this->var_id_to_dbg_decl_,(iterator)local_20._M_cur);
    std::
    set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
    ::~set((set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
            *)&__range3);
  }
  return (bool)(dbg_decl_itr.
                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                ._M_cur._3_1_ & 1);
}

Assistant:

bool DebugInfoManager::KillDebugDeclares(uint32_t variable_id) {
  bool modified = false;
  auto dbg_decl_itr = var_id_to_dbg_decl_.find(variable_id);
  if (dbg_decl_itr != var_id_to_dbg_decl_.end()) {
    // We intentionally copy the list of DebugDeclare instructions because
    // context()->KillInst(dbg_decl) will update |var_id_to_dbg_decl_|. If we
    // directly use |dbg_decl_itr->second|, it accesses a dangling pointer.
    auto copy_dbg_decls = dbg_decl_itr->second;

    for (auto* dbg_decl : copy_dbg_decls) {
      context()->KillInst(dbg_decl);
      modified = true;
    }
    var_id_to_dbg_decl_.erase(dbg_decl_itr);
  }
  return modified;
}